

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O3

bool __thiscall FParser::spec_elseif(FParser *this,bool lastif)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined1 uVar4;
  svalue_t eval;
  svalue_t local_40;
  
  local_40.string.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_40.type = 1;
  local_40.value.i = 0;
  iVar1 = FindOperator(this,0,this->NumTokens + -1,")");
  if (iVar1 == -1) {
    uVar4 = 0;
    script_error("parse error in elseif statement\n");
    goto LAB_00511a1e;
  }
  if (lastif) {
    pcVar3 = DFsScript::SectionEnd(this->Script,this->Section);
  }
  else {
    EvaluateExpression(this,&local_40,2,iVar1 + -1);
    iVar2 = intvalue(&local_40);
    if (((this->Section == (DFsSection *)0x0) || (this->BraceType != 0)) ||
       (iVar1 != this->NumTokens + -1)) {
      if (iVar2 == 0) {
        uVar4 = 0;
      }
      else {
        iVar2 = this->NumTokens + -1;
        uVar4 = 1;
        if (iVar1 != iVar2) {
          EvaluateExpression(this,&local_40,iVar1 + 1,iVar2);
        }
      }
      goto LAB_00511a1e;
    }
    uVar4 = 1;
    if (iVar2 != 0) goto LAB_00511a1e;
    pcVar3 = DFsScript::SectionEnd(this->Script,this->Section);
  }
  this->Rover = pcVar3 + 1;
  uVar4 = lastif;
LAB_00511a1e:
  FString::~FString(&local_40.string);
  return (bool)uVar4;
}

Assistant:

bool FParser::spec_elseif(bool lastif)
{
	int endtoken;
	svalue_t eval;
	
	if((endtoken = FindOperator(0, NumTokens-1, ")")) == -1)
	{
		script_error("parse error in elseif statement\n");
		return false;
	}
	
	if(lastif)
	{
		Rover = Script->SectionEnd(Section) + 1;
		return true;
	}
	// 2 to skip past the 'elseif' and '('
	EvaluateExpression(eval, 2, endtoken-1);
	bool ifresult = !!intvalue(eval);
	
	if(Section && BraceType == bracket_open
		&& endtoken == NumTokens-1)
    {
		// {} braces
		if(!ifresult)       // skip to end of section
			Rover = Script->SectionEnd(Section) + 1;
    }
	else if(ifresult)    // elseif() without {} braces
	{
		// nothing to do ?
		if(endtoken != NumTokens-1)
			EvaluateExpression(eval, endtoken+1, NumTokens-1);
	}
	
	return ifresult;
}